

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::RasterizationSamplesInstance::iterate
          (TestStatus *__return_storage_ptr__,RasterizationSamplesInstance *this)

{
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> level;
  UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> local_50;
  PixelBufferAccess local_40;
  
  MultisampleRenderer::render
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&local_50,
             (this->m_multisampleRenderer).
             super_UniqueBase<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
             .m_data.ptr);
  tcu::TextureLevel::getAccess(&local_40,local_50.m_data.ptr);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(__return_storage_ptr__,this,&local_40);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&local_50);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus RasterizationSamplesInstance::iterate (void)
{
	de::MovePtr<tcu::TextureLevel> level(m_multisampleRenderer->render());
	return verifyImage(level->getAccess());
}